

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSchur.h
# Opt level: O1

RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::RealSchur<Eigen::Matrix<double,-1,-1,0,-1,-1>>::compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *matrix,bool computeU)

{
  HessenbergDecomposition<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this_00;
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  double dVar4;
  long lVar5;
  char *__function;
  ulong uVar6;
  ActualDstType actualDst;
  long lVar7;
  Scalar SVar8;
  scalar_max_op<double,_double,_0> local_69;
  Scalar local_68;
  CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_58;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_48;
  Scalar local_30;
  undefined8 local_28;
  
  local_48.
  super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  .
  super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
  .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
  m_outerStride = *(Index *)(matrix + 8);
  if (*(ulong *)(matrix + 0x10) !=
      local_48.
      super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      .
      super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
      .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
      m_outerStride) {
    __assert_fail("matrix.cols() == matrix.rows()",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Eigenvalues/RealSchur.h"
                  ,0xfd,
                  "RealSchur<MatrixType> &Eigen::RealSchur<Eigen::Matrix<double, -1, -1>>::compute(const EigenBase<InputType> &, bool) [_MatrixType = Eigen::Matrix<double, -1, -1>, InputType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  local_58.m_xpr = (XprTypeNested)matrix;
  if (((long)*(ulong *)(matrix + 0x10) < 1) ||
     (local_48.
      super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      .
      super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
      .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
      m_outerStride < 1)) {
    __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Redux.h"
                  ,0x19b,
                  "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, -1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, -1>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
                 );
  }
  local_48.
  super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  .
  super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
  .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.data =
       *(double **)matrix;
  SVar8 = internal::
          redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>>,3,0>
          ::
          run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                    (&local_48,&local_69,&local_58);
  if (SVar8 < 2.2250738585072014e-308) {
    PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,
               *(Index *)(matrix + 8),*(Index *)(matrix + 0x10));
    if (computeU) {
      MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setIdentity
                ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x18),
                 *(Index *)(matrix + 8),*(Index *)(matrix + 0x10));
    }
    *(undefined4 *)(this + 0x80) = 0;
    this[0x84] = (RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>>)0x1;
    this[0x85] = (RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>>)computeU;
    return (RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this;
  }
  if ((long)(*(ulong *)(matrix + 0x10) |
            (ulong)*(RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>> **)(matrix + 8)) < 0) {
    __function = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
    ;
  }
  else {
    this_00 = (HessenbergDecomposition<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(this + 0x40);
    local_68 = SVar8;
    local_48.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
    .m_d._0_8_ = matrix;
    local_48.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
    .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.data =
         (double *)*(RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>> **)(matrix + 8);
    local_48.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
    .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
    m_outerStride = *(ulong *)(matrix + 0x10);
    local_30 = SVar8;
    HessenbergDecomposition<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    compute<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
              (this_00,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                        *)&local_48);
    lVar3 = *(long *)(matrix + 0x10);
    if (lVar3 < 0) {
      __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x130,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x30),lVar3,lVar3,1);
    if (computeU) {
      if (this[0x78] == (RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>>)0x0) {
        __assert_fail("m_isInitialized && \"HessenbergDecomposition is not initialized.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Eigenvalues/./HessenbergDecomposition.h"
                      ,0xec,
                      "HouseholderSequenceType Eigen::HessenbergDecomposition<Eigen::Matrix<double, -1, -1>>::matrixQ() const [_MatrixType = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      local_48.
      super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      .
      super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
      .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.data =
           (double *)(this + 0x58);
      local_30 = (Scalar)(*(long *)(this + 0x48) + -1);
      local_48.
      super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      .
      super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
      .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
      m_outerStride =
           local_48.
           super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           .
           super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
           .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
           m_outerStride & 0xffffffffffffff00;
      local_28 = 1;
      local_48.
      super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      .
      super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
      .m_d._0_8_ = this_00;
      HouseholderSequence<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,1>::
      evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                ((HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
                  *)&local_48,(Matrix<double,__1,__1,_0,__1,__1> *)(this + 0x18),
                 (Matrix<double,__1,_1,_0,__1,_1> *)(this + 0x30));
    }
    if (this[0x78] == (RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>>)0x0) {
      __assert_fail("m_isInitialized && \"HessenbergDecomposition is not initialized.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Eigenvalues/./HessenbergDecomposition.h"
                    ,0x108,
                    "MatrixHReturnType Eigen::HessenbergDecomposition<Eigen::Matrix<double, -1, -1>>::matrixH() const [_MatrixType = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    local_48.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
    .m_d._0_8_ = this_00;
    computeFromHessenberg<Eigen::internal::HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
              (this,(HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                     *)&local_48,(Matrix<double,__1,__1,_0,__1,__1> *)(this + 0x18),computeU);
    if (-1 < (long)(*(ulong *)(this + 0x10) | *(ulong *)(this + 8))) {
      lVar3 = *(long *)this;
      lVar5 = *(ulong *)(this + 0x10) * *(ulong *)(this + 8);
      uVar6 = lVar5 - (lVar5 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < lVar5) {
        lVar7 = 0;
        do {
          pdVar1 = (double *)(lVar3 + lVar7 * 8);
          dVar4 = pdVar1[1];
          pdVar2 = (double *)(lVar3 + lVar7 * 8);
          *pdVar2 = *pdVar1 * local_68;
          pdVar2[1] = dVar4 * local_68;
          lVar7 = lVar7 + 2;
        } while (lVar7 < (long)uVar6);
      }
      if (lVar5 <= (long)uVar6) {
        return (RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this;
      }
      do {
        *(double *)(lVar3 + uVar6 * 8) = *(double *)(lVar3 + uVar6 * 8) * local_68;
        uVar6 = uVar6 + 1;
      } while (lVar5 - uVar6 != 0);
      return (RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this;
    }
    __function = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x4a,__function);
}

Assistant:

inline void RealSchur<MatrixType>::initFrancisQRStep(Index il, Index iu, const Vector3s& shiftInfo, Index& im, Vector3s& firstHouseholderVector)
{
  using std::abs;
  Vector3s& v = firstHouseholderVector; // alias to save typing

  for (im = iu-2; im >= il; --im)
  {
    const Scalar Tmm = m_matT.coeff(im,im);
    const Scalar r = shiftInfo.coeff(0) - Tmm;
    const Scalar s = shiftInfo.coeff(1) - Tmm;
    v.coeffRef(0) = (r * s - shiftInfo.coeff(2)) / m_matT.coeff(im+1,im) + m_matT.coeff(im,im+1);
    v.coeffRef(1) = m_matT.coeff(im+1,im+1) - Tmm - r - s;
    v.coeffRef(2) = m_matT.coeff(im+2,im+1);
    if (im == il) {
      break;
    }
    const Scalar lhs = m_matT.coeff(im,im-1) * (abs(v.coeff(1)) + abs(v.coeff(2)));
    const Scalar rhs = v.coeff(0) * (abs(m_matT.coeff(im-1,im-1)) + abs(Tmm) + abs(m_matT.coeff(im+1,im+1)));
    if (abs(lhs) < NumTraits<Scalar>::epsilon() * rhs)
      break;
  }
}